

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_int>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom)

{
  uint uVar1;
  uint in_ESI;
  DivideTest<unsigned_int> *in_RDI;
  uint recovered;
  divider<unsigned_int,_(libdivide::Branching)1> the_divider;
  libdivide_u32_t tmp;
  libdivide_u32_branchfree_t ret;
  uint32_t twice_rem;
  uint32_t e;
  uint32_t proposed_m;
  uint32_t rem;
  uint8_t more;
  uint32_t floor_log_2_d;
  libdivide_u32_t result;
  uint32_t result_1;
  divider<unsigned_int,_(libdivide::Branching)1> *in_stack_ffffffffffffff00;
  ostream *poVar2;
  undefined8 in_stack_ffffffffffffff08;
  string *psVar3;
  uint denom_00;
  DivideTest<unsigned_int> *in_stack_ffffffffffffff10;
  divider<unsigned_int,_(libdivide::Branching)1> *pdVar4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  DivideTest<unsigned_int> *in_stack_ffffffffffffff30;
  string local_c8 [32];
  uint local_a8;
  divider<unsigned_int,_(libdivide::Branching)1> local_a1;
  uint local_9c;
  divider<unsigned_int,_(libdivide::Branching)1> *local_88;
  divider<unsigned_int,_(libdivide::Branching)1> *local_78;
  uint32_t local_70;
  byte local_6c;
  uint32_t uVar6;
  byte bVar7;
  uint32_t uVar8;
  byte bVar9;
  uint32_t uVar10;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar11;
  int local_40;
  DivideTest<unsigned_int> local_3c;
  int local_34;
  undefined4 local_30;
  uint32_t local_25;
  byte local_21;
  int local_1c;
  DivideTest<unsigned_int> *local_18;
  undefined4 local_8;
  uint local_4;
  
  denom_00 = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (in_ESI != 1) {
    pdVar4 = &local_a1;
    local_88 = pdVar4;
    local_78 = pdVar4;
    if (in_ESI == 1) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x3e1,"libdivide_u32_branchfree_gen",
              "branchfree divider must be != 1");
      abort();
    }
    local_30 = 1;
    if (in_ESI == 0) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x3ab,"libdivide_internal_u32_gen",
              "divider must be != 0");
      abort();
    }
    local_34 = 0x1f - LZCOUNT(in_ESI);
    local_21 = (byte)local_34;
    if ((in_ESI & in_ESI - 1) == 0) {
      local_25 = 0;
      local_21 = local_21 - 1;
    }
    else {
      local_4 = 1 << (local_21 & 0x1f);
      local_8 = 0;
      in_stack_ffffffffffffff10 = &local_3c;
      local_1c = (int)(((ulong)local_4 << 0x20) / (ulong)in_ESI);
      uVar1 = (uint)(((ulong)local_4 << 0x20) % (ulong)in_ESI);
      local_40 = local_1c * 2;
      uVar5 = uVar1 * 2;
      if ((in_ESI <= uVar5) || (uVar5 < uVar1)) {
        local_40 = local_40 + 1;
      }
      local_3c.rand_n._3_1_ = local_21 | 0x40;
      local_25 = local_40 + 1;
      local_21 = local_3c.rand_n._3_1_;
      local_18 = in_stack_ffffffffffffff10;
    }
    uVar11 = CONCAT31((int3)((uint)in_stack_ffffffffffffffb4 >> 8),local_21);
    local_6c = local_21 & 0x1f;
    local_70 = local_25;
    local_a1.div.denom.magic = local_25;
    local_9c = in_ESI;
    uVar6 = local_25;
    bVar7 = local_21;
    uVar8 = local_25;
    bVar9 = local_6c;
    uVar10 = local_25;
    local_a1.div.denom.more = local_6c;
    local_a8 = libdivide::divider<unsigned_int,_(libdivide::Branching)1>::recover(&local_a1);
    uVar5 = (uint)((ulong)pdVar4 >> 0x20);
    if (local_a8 != local_9c) {
      poVar2 = (ostream *)&std::cerr;
      std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
      psVar3 = local_c8;
      testcase_name_abi_cxx11_
                ((DivideTest<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (int)((ulong)in_RDI >> 0x20));
      std::operator<<(poVar2,psVar3);
      std::__cxx11::string::~string(local_c8);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,local_9c);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,local_a8);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
    test_edgecase_numerators<(libdivide::Branching)1>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (divider<unsigned_int,_(libdivide::Branching)1> *)in_RDI);
    test_small_numerators<(libdivide::Branching)1>
              (in_stack_ffffffffffffff10,denom_00,in_stack_ffffffffffffff00);
    test_pow2_numerators<(libdivide::Branching)1>
              (in_RDI,uVar5,
               (divider<unsigned_int,_(libdivide::Branching)1> *)in_stack_ffffffffffffff10);
    test_allbits_numerators<(libdivide::Branching)1>
              (in_stack_ffffffffffffff10,denom_00,in_stack_ffffffffffffff00);
    test_random_numerators<(libdivide::Branching)1>
              (in_RDI,uVar5,
               (divider<unsigned_int,_(libdivide::Branching)1> *)in_stack_ffffffffffffff10);
    test_vectordivide_numerators<(libdivide::Branching)1>
              ((DivideTest<unsigned_int> *)CONCAT44(uVar11,uVar10),
               CONCAT13(bVar9,(int3)(uVar8 >> 8)),
               (divider<unsigned_int,_(libdivide::Branching)1> *)
               CONCAT44(in_ESI,CONCAT13(bVar7,(int3)(uVar6 >> 8))));
  }
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }